

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMEntityImpl.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::DOMEntityImpl::DOMEntityImpl(DOMEntityImpl *this,DOMDocument *ownerDoc,XMLCh *eName)

{
  XMLCh *pXVar1;
  DOMNode *ownerNode;
  
  (this->super_DOMEntity).super_DOMNode._vptr_DOMNode = (_func_int **)&PTR__DOMEntityImpl_003fdae8;
  (this->super_HasDOMNodeImpl)._vptr_HasDOMNodeImpl = (_func_int **)&PTR__DOMEntityImpl_003fdcb8;
  (this->super_HasDOMParentImpl)._vptr_HasDOMParentImpl = (_func_int **)&PTR__DOMEntityImpl_003fdce8
  ;
  ownerNode = &ownerDoc->super_DOMNode;
  if (ownerDoc == (DOMDocument *)0x0) {
    ownerNode = (DOMNode *)0x0;
  }
  DOMNodeImpl::DOMNodeImpl(&this->fNode,(DOMNode *)this,ownerNode);
  DOMParentNode::DOMParentNode(&this->fParent,(DOMNode *)this,ownerDoc);
  this->fXmlVersion = (XMLCh *)0x0;
  this->fBaseURI = (XMLCh *)0x0;
  this->fInputEncoding = (XMLCh *)0x0;
  this->fXmlEncoding = (XMLCh *)0x0;
  this->fNotationName = (XMLCh *)0x0;
  this->fRefEntity = (DOMEntityReference *)0x0;
  this->fPublicId = (XMLCh *)0x0;
  this->fSystemId = (XMLCh *)0x0;
  this->fEntityRefNodeCloned = false;
  pXVar1 = DOMDocumentImpl::getPooledString((DOMDocumentImpl *)&ownerDoc[-1].super_DOMNode,eName);
  this->fName = pXVar1;
  DOMNodeImpl::setReadOnly(&this->fNode,true,true);
  return;
}

Assistant:

DOMEntityImpl::DOMEntityImpl(DOMDocument *ownerDoc, const XMLCh *eName)
   : fNode(this, ownerDoc),
     fParent(this, ownerDoc),
     fPublicId(0),
     fSystemId(0),
     fNotationName(0),
     fRefEntity(0),
     fInputEncoding(0),
     fXmlEncoding(0),
     fXmlVersion(0),
     fBaseURI(0),
     fEntityRefNodeCloned(false)
{
    fName        = ((DOMDocumentImpl *)ownerDoc)->getPooledString(eName);
    fNode.setReadOnly(true, true);
}